

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gz_creation.c
# Opt level: O3

int test_gz_creation(void)

{
  int iVar1;
  size_t __n;
  long lVar2;
  char *pcVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  char *pcVar7;
  size_t compr_size;
  size_t decompr_size;
  char *strings [8];
  long local_88;
  size_t local_80;
  char *local_78 [9];
  
  local_78[0] = anon_var_dwarf_10b;
  local_78[1] = "a";
  local_78[2] = "Hello world";
  local_78[3] = anon_var_dwarf_16b;
  local_78[4] = 
  "Lorem Ipsum is simply dummy text of the printing and typesetting industry. Lorem Ipsum has been the industry\'s standard dummy text ever since the 1500s, when an unknown printer took a galley of type and scrambled it to make a type specimen book. It has survived not only five centuries, but also the leap into electronic typesetting, remaining essentially unchanged. It was popularised in the 1960s with the release of Letraset sheets containing Lorem Ipsum passages, and more recently with desktop publishing software like Aldus PageMaker including versions of Lorem Ipsum"
  ;
  local_78[5] = anon_var_dwarf_1a8;
  local_78[6] = anon_var_dwarf_1c7;
  local_78[7] = anon_var_dwarf_1e6;
  lVar6 = 0;
  while( true ) {
    pcVar7 = local_78[lVar6];
    __n = strlen(pcVar7);
    if (__n == 0) {
      __assert_fail("src_string_len > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x49,"int test_gz_creation_string(void)");
    }
    local_88 = 0;
    lVar2 = nhr_gz_compress(pcVar7,__n,&local_88,0);
    if (lVar2 == 0) {
      __assert_fail("compr_buff",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x4d,"int test_gz_creation_string(void)");
    }
    if (local_88 == 0) {
      __assert_fail("compr_size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x4e,"int test_gz_creation_string(void)");
    }
    local_80 = 0;
    pcVar3 = (char *)nhr_gz_decompress(lVar2,local_88,&local_80,0);
    if (__n != local_80) {
      __assert_fail("src_string_len == decompr_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x53,"int test_gz_creation_string(void)");
    }
    iVar1 = strncmp(pcVar7,pcVar3,__n);
    if (iVar1 != 0) {
      __assert_fail("strncmp(src_string, decompr_string, decompr_size) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x54,"int test_gz_creation_string(void)");
    }
    nhr_free(lVar2);
    nhr_free(pcVar3);
    local_88 = 0;
    lVar2 = nhr_gz_compress(pcVar7,__n,&local_88,1);
    if (lVar2 == 0) {
      __assert_fail("compr_buff",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x5c,"int test_gz_creation_string(void)");
    }
    if (local_88 == 0) {
      __assert_fail("compr_size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x5d,"int test_gz_creation_string(void)");
    }
    local_80 = 0;
    pcVar3 = (char *)nhr_gz_decompress(lVar2,local_88,&local_80);
    if (__n != local_80) break;
    iVar1 = strncmp(pcVar7,pcVar3,__n);
    if (iVar1 != 0) {
      __assert_fail("strncmp(src_string, decompr_string, decompr_size) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,99,"int test_gz_creation_string(void)");
    }
    nhr_free(lVar2);
    nhr_free(pcVar3);
    lVar6 = lVar6 + 1;
    if (lVar6 == 8) {
      pcVar7 = "\x7fELF\x02\x01\x01";
      while( true ) {
        pvVar4 = (void *)nhr_malloc(pcVar7);
        local_88 = 0;
        lVar6 = nhr_gz_compress(pvVar4,pcVar7,&local_88,0);
        if (lVar6 == 0) {
          __assert_fail("compr_buff",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x77,"int test_gz_big_data(void)");
        }
        if (local_88 == 0) {
          __assert_fail("compr_size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x78,"int test_gz_big_data(void)");
        }
        local_78[0] = (char *)0x0;
        pvVar5 = (void *)nhr_gz_decompress(lVar6,local_88,local_78,0);
        if (pcVar7 != local_78[0]) {
          __assert_fail("src_size == dst_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x7d,"int test_gz_big_data(void)");
        }
        iVar1 = bcmp(pvVar4,pvVar5,(size_t)pcVar7);
        if (iVar1 != 0) {
          __assert_fail("memcmp(src, dst, src_size) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x7e,"int test_gz_big_data(void)");
        }
        nhr_free(pvVar4);
        nhr_free(pvVar5);
        pvVar4 = (void *)nhr_malloc(pcVar7);
        local_88 = 0;
        lVar6 = nhr_gz_compress(pvVar4,pcVar7,&local_88,1);
        if (lVar6 == 0) {
          __assert_fail("compr_buff",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x88,"int test_gz_big_data(void)");
        }
        if (local_88 == 0) {
          __assert_fail("compr_size > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x89,"int test_gz_big_data(void)");
        }
        local_78[0] = (char *)0x0;
        pvVar5 = (void *)nhr_gz_decompress(lVar6,local_88,local_78);
        if (pcVar7 != local_78[0]) {
          __assert_fail("src_size == dst_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                        ,0x8e,"int test_gz_big_data(void)");
        }
        iVar1 = bcmp(pvVar4,pvVar5,(size_t)pcVar7);
        if (iVar1 != 0) break;
        nhr_free(pvVar4);
        nhr_free(pvVar5);
        pcVar7 = pcVar7 + 0x100000;
        if (pcVar7 == (char *)0xa00000) {
          return 0;
        }
      }
      __assert_fail("memcmp(src, dst, src_size) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                    ,0x8f,"int test_gz_big_data(void)");
    }
  }
  __assert_fail("src_string_len == decompr_size",
                "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/tests/test_gz_creation.c"
                ,0x62,"int test_gz_creation_string(void)");
}

Assistant:

static int test_gz_creation_string(void) {
	const char * strings[STRINGS_COUNT];
	int i;
	const char * src_string;
	size_t src_string_len, compr_size, decompr_size;
	void * compr_buff;
	char * decompr_string;

	strings[0] = test_gz_string1;
	strings[1] = test_gz_string2;
	strings[2] = test_gz_string3;
	strings[3] = test_gz_string4;
	strings[4] = test_gz_string5;
	strings[5] = test_gz_string6;
	strings[6] = test_gz_string7;
	strings[7] = test_gz_string8;

	for (i = 0; i < STRINGS_COUNT; i++) {
		src_string = strings[i];
		src_string_len = strlen(src_string);
		assert(src_string_len > 0);

		compr_size = 0;
		compr_buff = nhr_gz_compress(src_string, src_string_len, &compr_size, NHR_GZ_METHOD_DEFLATE);
		assert(compr_buff);
		assert(compr_size > 0);

		decompr_size = 0;
		decompr_string = (char *)nhr_gz_decompress(compr_buff, compr_size, &decompr_size, NHR_GZ_METHOD_DEFLATE);

		assert(src_string_len == decompr_size);
		assert(strncmp(src_string, decompr_string, decompr_size) == 0);

		nhr_free(compr_buff);
		nhr_free(decompr_string);


		compr_size = 0;
		compr_buff = nhr_gz_compress(src_string, src_string_len, &compr_size, NHR_GZ_METHOD_GZIP);
		assert(compr_buff);
		assert(compr_size > 0);

		decompr_size = 0;
		decompr_string = (char *)nhr_gz_decompress(compr_buff, compr_size, &decompr_size, NHR_GZ_METHOD_GZIP);

		assert(src_string_len == decompr_size);
		assert(strncmp(src_string, decompr_string, decompr_size) == 0);

		nhr_free(compr_buff);
		nhr_free(decompr_string);
	}
	return 0;
}